

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  CallLogWrapper *pCVar1;
  TestLog *log;
  char *__s;
  char *__rhs;
  ApiCase *pAVar2;
  bool bVar3;
  GLuint GVar4;
  GLuint shader;
  GLuint program;
  ostream *poVar5;
  long lVar6;
  allocator<char> local_252;
  allocator<char> local_251;
  CallLogWrapper *local_250;
  GLuint local_244;
  ApiCase *local_240;
  GLuint local_234;
  string fragmentSource;
  char *fragmentSourceCStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ScopedLogSection local_1b0;
  ostringstream frag;
  
  pCVar1 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b30);
  program = glu::CallLogWrapper::glCreateProgram(pCVar1);
  glu::CallLogWrapper::glAttachShader(pCVar1,program,GVar4);
  local_244 = shader;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader);
  glu::CallLogWrapper::glShaderSource(pCVar1,GVar4,1,&test::vertSource,(GLint *)0x0);
  local_250 = pCVar1;
  local_234 = GVar4;
  glu::CallLogWrapper::glCompileShader(pCVar1,GVar4);
  local_240 = &this->super_ApiCase;
  ApiCase::expectError(&this->super_ApiCase,0);
  lVar6 = 0x30;
  while( true ) {
    pCVar1 = local_250;
    if (lVar6 == 0x928) break;
    log = local_240->m_log;
    __s = *(char **)((long)&PTR_deinit_01e3f220 + lVar6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&frag,__s,&local_251);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"Verify type of ",&local_252);
    std::operator+(&local_1d0,&local_1f0,__s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentSourceCStr,&local_1d0," variable");
    __rhs = *(char **)((long)&PTR_iterate_01e3f228 + lVar6);
    std::operator+(&fragmentSource,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentSourceCStr,__rhs);
    tcu::ScopedLogSection::ScopedLogSection(&local_1b0,log,(string *)&frag,&fragmentSource);
    tcu::ScopedLogSection::~ScopedLogSection(&local_1b0);
    std::__cxx11::string::~string((string *)&fragmentSource);
    std::__cxx11::string::~string((string *)&fragmentSourceCStr);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&frag);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
    std::operator<<((ostream *)&frag,"#version 300 es\n");
    poVar5 = std::operator<<((ostream *)&frag,
                             *(char **)((long)&Functional::(anonymous_namespace)::ProgramUniformCase
                                               ::typeinfo + lVar6));
    poVar5 = std::operator<<(poVar5,"uniform ");
    poVar5 = std::operator<<(poVar5,*(char **)((long)&PTR_test_01e3f230 + lVar6));
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,__s);
    poVar5 = std::operator<<(poVar5," uniformValue");
    poVar5 = std::operator<<(poVar5,__rhs);
    std::operator<<(poVar5,";\n");
    std::operator<<((ostream *)&frag,"layout(location = 0) out mediump vec4 fragColor;\n");
    std::operator<<((ostream *)&frag,"void main (void)\n");
    std::operator<<((ostream *)&frag,"{\n");
    poVar5 = std::operator<<((ostream *)&frag,"\tfragColor = vec4(");
    poVar5 = std::operator<<(poVar5,*(char **)((long)&PTR_typeinfo_name_01e3f240 + lVar6));
    std::operator<<(poVar5,");\n");
    std::operator<<((ostream *)&frag,"}\n");
    std::__cxx11::stringbuf::str();
    GVar4 = local_244;
    pCVar1 = local_250;
    fragmentSourceCStr =
         (char *)CONCAT44(fragmentSource._M_dataplus._M_p._4_4_,
                          fragmentSource._M_dataplus._M_p._0_4_);
    glu::CallLogWrapper::glShaderSource(local_250,local_244,1,&fragmentSourceCStr,(GLint *)0x0);
    std::__cxx11::string::~string((string *)&fragmentSource);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar4);
    glu::CallLogWrapper::glLinkProgram(local_250,program);
    bVar3 = verifyProgramParam((((ApiCase *)&local_240->super_TestCase)->super_TestCase).
                               super_TestCase.super_TestNode.m_testCtx,local_250,program,0x8b82,1);
    if (bVar3) {
      fragmentSourceCStr = "uniformValue";
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::
      StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_int> *)&fragmentSource);
      pCVar1 = local_250;
      glu::CallLogWrapper::glGetUniformIndices
                (local_250,program,1,&fragmentSourceCStr,
                 (GLuint *)((long)&fragmentSource._M_dataplus._M_p + 4));
      pAVar2 = local_240;
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                ((StateQueryMemoryWriteGuard<unsigned_int> *)&fragmentSource,
                 (((ApiCase *)&local_240->super_TestCase)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx);
      verifyActiveUniformParam
                ((((ApiCase *)&pAVar2->super_TestCase)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx,pCVar1,program,fragmentSource._M_dataplus._M_p._4_4_,
                 0x8a37,*(GLenum *)((long)&PTR_typeinfo_01e3f248 + lVar6));
      verifyActiveUniformParam
                ((((ApiCase *)&pAVar2->super_TestCase)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx,pCVar1,program,fragmentSource._M_dataplus._M_p._4_4_,
                 0x8a38,*(GLenum *)((long)&PTR_typeinfo_01e3f248 + lVar6 + 4));
      verifyActiveUniformParam
                ((((ApiCase *)&pAVar2->super_TestCase)->super_TestCase).super_TestCase.
                 super_TestNode.m_testCtx,pCVar1,program,fragmentSource._M_dataplus._M_p._4_4_,
                 0x8a3e,*(GLenum *)((long)&DAT_01e3f250 + lVar6));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
    lVar6 = lVar6 + 0x38;
  }
  glu::CallLogWrapper::glDeleteShader(local_250,local_234);
  glu::CallLogWrapper::glDeleteShader(pCVar1,local_244);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,program);
  ApiCase::expectError(local_240,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",						"uniformValue",							GL_FLOAT,							1, GL_FALSE },
			{ "float[2]",				"",			"highp",	"",						"uniformValue[1]",						GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",						"uniformValue.x",						GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",						"float(uniformValue)",					GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_INT_VEC4,						1, GL_FALSE },
			{ "uint",					"",			"highp",	"",						"float(uniformValue)",					GL_UNSIGNED_INT,					1, GL_FALSE },
			{ "uvec2",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC2,				1, GL_FALSE },
			{ "uvec3",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC3,				1, GL_FALSE },
			{ "uvec4",					"",			"highp",	"",						"float(uniformValue.x)",				GL_UNSIGNED_INT_VEC4,				1, GL_FALSE },
			{ "bool",					"",			"",			"",						"float(uniformValue)",					GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",						"float(uniformValue.x)",				GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "mat2x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x3,					1, GL_FALSE },
			{ "mat2x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT2x4,					1, GL_FALSE },
			{ "mat3x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x2,					1, GL_FALSE },
			{ "mat3x4",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT3x4,					1, GL_FALSE },
			{ "mat4x2",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x2,					1, GL_FALSE },
			{ "mat4x3",					"",			"highp",	"",						"float(uniformValue[0][0])",			GL_FLOAT_MAT4x3,					1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D,						1, GL_FALSE },
			{ "sampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_3D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE,					1, GL_FALSE },
			{ "sampler2DShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_SHADOW,				1, GL_FALSE },
			{ "sampler2DArray",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY,				1, GL_FALSE },
			{ "sampler2DArrayShadow",	"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_2D_ARRAY_SHADOW,			1, GL_FALSE },
			{ "samplerCubeShadow",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_SAMPLER_CUBE_SHADOW,				1, GL_FALSE },
			{ "isampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D,					1, GL_FALSE },
			{ "isampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_3D,					1, GL_FALSE },
			{ "isamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_CUBE,				1, GL_FALSE },
			{ "isampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_INT_SAMPLER_2D_ARRAY,			1, GL_FALSE },
			{ "usampler2D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D,			1, GL_FALSE },
			{ "usampler3D",				"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_3D,			1, GL_FALSE },
			{ "usamplerCube",			"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_CUBE,		1, GL_FALSE },
			{ "usampler2DArray",		"",			"highp",	"",						"float(textureSize(uniformValue,0).r)",	GL_UNSIGNED_INT_SAMPLER_2D_ARRAY,	1, GL_FALSE },
		};

		static const char* vertSource =
			"#version 300 es\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << "#version 300 es\n";
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "layout(location = 0) out mediump vec4 fragColor;\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	fragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const char* uniformNames[] = {"uniformValue"};
				StateQueryMemoryWriteGuard<GLuint> uniformIndex;
				glGetUniformIndices(program, 1, uniformNames, &uniformIndex);
				uniformIndex.verifyValidity(m_testCtx);

				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_TYPE,			uniformTypes[ndx].type);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_SIZE,			uniformTypes[ndx].size);
				verifyActiveUniformParam(m_testCtx, *this, program, uniformIndex, GL_UNIFORM_IS_ROW_MAJOR,	uniformTypes[ndx].isRowMajor);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}